

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  int iVar1;
  Type TVar2;
  char *pcVar3;
  ostream *poVar4;
  TestPartResult *in_RSI;
  ostream *in_RDI;
  TestPartResult *in_stack_ffffffffffffffd0;
  
  pcVar3 = TestPartResult::file_name(in_stack_ffffffffffffffd0);
  poVar4 = std::operator<<(in_RDI,pcVar3);
  poVar4 = std::operator<<(poVar4,":");
  iVar1 = TestPartResult::line_number(in_RSI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,": ");
  TVar2 = TestPartResult::type(in_RSI);
  if (TVar2 == kSuccess) {
    pcVar3 = "Success";
  }
  else {
    TVar2 = TestPartResult::type(in_RSI);
    pcVar3 = "Non-fatal failure";
    if (TVar2 == kFatalFailure) {
      pcVar3 = "Fatal failure";
    }
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,":\n");
  pcVar3 = TestPartResult::message((TestPartResult *)0x1852dc);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return poVar4;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os
      << result.file_name() << ":" << result.line_number() << ": "
      << (result.type() == TestPartResult::kSuccess ? "Success" :
          result.type() == TestPartResult::kFatalFailure ? "Fatal failure" :
          "Non-fatal failure") << ":\n"
      << result.message() << std::endl;
}